

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O0

int CfdGetDescriptorData
              (void *handle,void *descriptor_handle,uint32_t index,uint32_t *max_index,
              uint32_t *depth,int *script_type,char **locking_script,char **address,int *hash_type,
              char **redeem_script,int *key_type,char **pubkey,char **ext_pubkey,char **ext_privkey,
              bool *is_multisig,uint32_t *max_key_num,uint32_t *req_sig_num)

{
  bool bVar1;
  size_type sVar2;
  undefined8 uVar3;
  ulong uVar4;
  uint *in_RCX;
  uint in_EDX;
  long in_RSI;
  uint32_t *in_R8;
  DescriptorScriptType *in_R9;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  AddressType *in_stack_00000018;
  undefined8 *in_stack_00000020;
  DescriptorKeyType *in_stack_00000028;
  undefined8 *in_stack_00000030;
  undefined8 *in_stack_00000038;
  undefined8 *in_stack_00000040;
  undefined1 *in_stack_00000048;
  undefined4 *in_stack_00000050;
  uint32_t *in_stack_00000058;
  CfdException *except;
  exception *std_except;
  SchnorrPubkey schnorr_pubkey_obj;
  ExtPrivkey ext_privkey_obj;
  ExtPubkey ext_pubkey_obj;
  Pubkey pubkey_obj;
  string addr;
  uint32_t last_index;
  DescriptorScriptData *desc_data;
  CfdCapiOutputDescriptor *buffer;
  char *work_ext_privkey;
  char *work_ext_pubkey;
  char *work_pubkey;
  char *work_redeem_script;
  char *work_address;
  char *work_locking_script;
  size_type in_stack_fffffffffffffa38;
  ExtPrivkey *in_stack_fffffffffffffa40;
  undefined7 in_stack_fffffffffffffa50;
  undefined1 in_stack_fffffffffffffa57;
  undefined8 in_stack_fffffffffffffa58;
  CfdError error_code;
  undefined7 in_stack_fffffffffffffa60;
  undefined1 in_stack_fffffffffffffa67;
  ExtPubkey *in_stack_fffffffffffffaa0;
  byte local_521;
  string local_4d0 [24];
  undefined8 in_stack_fffffffffffffb48;
  void *in_stack_fffffffffffffb50;
  string local_490;
  string local_470;
  Pubkey local_450;
  SchnorrPubkey local_438;
  Pubkey local_420;
  ExtPubkey local_408;
  Pubkey local_398;
  ExtPubkey local_380;
  ExtPrivkey local_310;
  SchnorrPubkey local_298;
  ExtPrivkey local_280;
  ExtPubkey local_208;
  Pubkey local_198;
  string local_180;
  string local_160;
  byte local_139;
  string local_138;
  string local_118;
  uint local_f4;
  reference local_f0;
  undefined1 local_e2;
  allocator local_e1;
  string local_e0 [32];
  CfdSourceLocation local_c0;
  long local_a8;
  allocator local_99;
  string local_98 [48];
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  DescriptorScriptType *local_38;
  uint32_t *local_30;
  uint *local_28;
  uint local_1c;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffa58 >> 0x20);
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  local_50 = (char *)0x0;
  local_58 = (char *)0x0;
  local_60 = (char *)0x0;
  local_68 = (char *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"Descriptor",&local_99);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffb50,(string *)in_stack_fffffffffffffb48);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  local_a8 = local_18;
  if ((*(long *)(local_18 + 0x18) != 0) &&
     (uVar4 = (ulong)local_1c,
     sVar2 = std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::
             size(*(vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> **
                   )(local_18 + 0x18)), uVar4 < sVar2)) {
    local_f0 = std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::
               at((vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)
                  in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
    sVar2 = std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::size
                      (*(vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>
                         **)(local_a8 + 0x18));
    local_f4 = (int)sVar2 - 1;
    if (local_28 != (uint *)0x0) {
      *local_28 = local_f4;
    }
    if (local_30 != (uint32_t *)0x0) {
      *local_30 = local_f0->depth;
    }
    if (local_38 != (DescriptorScriptType *)0x0) {
      *local_38 = local_f0->type;
    }
    if ((in_stack_00000008 != (undefined8 *)0x0) &&
       (bVar1 = cfd::core::Script::IsEmpty(&local_f0->locking_script), !bVar1)) {
      cfd::core::Script::GetHex_abi_cxx11_(&local_118,&local_f0->locking_script);
      local_40 = cfd::capi::CreateString((string *)in_stack_fffffffffffffaa0);
      std::__cxx11::string::~string((string *)&local_118);
    }
    local_139 = 0;
    local_521 = 0;
    if (in_stack_00000010 != (undefined8 *)0x0) {
      cfd::core::Address::GetAddress_abi_cxx11_(&local_138,&local_f0->address);
      local_139 = 1;
      local_521 = std::__cxx11::string::empty();
      local_521 = local_521 ^ 0xff;
    }
    if ((local_139 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_138);
    }
    if ((local_521 & 1) != 0) {
      cfd::core::Address::GetAddress_abi_cxx11_(&local_160,&local_f0->address);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        local_48 = cfd::capi::CreateString((string *)in_stack_fffffffffffffaa0);
      }
      std::__cxx11::string::~string((string *)&local_160);
    }
    if (in_stack_00000018 != (AddressType *)0x0) {
      *in_stack_00000018 = local_f0->address_type;
    }
    if ((in_stack_00000020 != (undefined8 *)0x0) &&
       (bVar1 = cfd::core::Script::IsEmpty(&local_f0->redeem_script), !bVar1)) {
      cfd::core::Script::GetHex_abi_cxx11_(&local_180,&local_f0->redeem_script);
      local_50 = cfd::capi::CreateString((string *)in_stack_fffffffffffffaa0);
      std::__cxx11::string::~string((string *)&local_180);
    }
    if (in_stack_00000028 != (DescriptorKeyType *)0x0) {
      *in_stack_00000028 = local_f0->key_type;
    }
    cfd::core::Pubkey::Pubkey(&local_198);
    cfd::core::ExtPubkey::ExtPubkey(&local_208);
    cfd::core::ExtPrivkey::ExtPrivkey(&local_280);
    cfd::core::SchnorrPubkey::SchnorrPubkey(&local_298);
    switch(local_f0->key_type) {
    case kDescriptorKeyPublic:
    default:
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        cfd::core::Pubkey::Pubkey(&local_450,&local_f0->key);
        cfd::core::Pubkey::operator=(&local_198,&local_450);
        cfd::core::Pubkey::~Pubkey((Pubkey *)0x5832a4);
      }
      break;
    case kDescriptorKeyBip32:
      cfd::core::ExtPubkey::ExtPubkey(&local_408,&local_f0->key);
      cfd::core::ExtPubkey::operator=(&local_208,&local_408);
      cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffffa40);
      cfd::core::ExtPubkey::GetPubkey(&local_420,&local_208);
      cfd::core::Pubkey::operator=(&local_198,&local_420);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x583203);
      break;
    case kDescriptorKeyBip32Priv:
      cfd::core::ExtPrivkey::ExtPrivkey(&local_310,&local_f0->key);
      cfd::core::ExtPrivkey::operator=(&local_280,&local_310);
      cfd::core::ExtPrivkey::~ExtPrivkey(in_stack_fffffffffffffa40);
      cfd::core::ExtPrivkey::GetExtPubkey(&local_380,&local_280);
      in_stack_fffffffffffffaa0 = &local_208;
      cfd::core::ExtPubkey::operator=(in_stack_fffffffffffffaa0,&local_380);
      cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffffa40);
      cfd::core::ExtPubkey::GetPubkey(&local_398,in_stack_fffffffffffffaa0);
      cfd::core::Pubkey::operator=(&local_198,&local_398);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x583168);
      break;
    case kDescriptorKeySchnorr:
      cfd::core::SchnorrPubkey::SchnorrPubkey(&local_438,&local_f0->key);
      cfd::core::SchnorrPubkey::operator=(&local_298,&local_438);
      cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x583248);
    }
    if ((in_stack_00000030 == (undefined8 *)0x0) ||
       (bVar1 = cfd::core::Pubkey::IsValid(&local_198), !bVar1)) {
      if ((in_stack_00000030 != (undefined8 *)0x0) &&
         (bVar1 = cfd::core::SchnorrPubkey::IsValid(&local_298), bVar1)) {
        cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_490,&local_298);
        local_58 = cfd::capi::CreateString((string *)in_stack_fffffffffffffaa0);
        std::__cxx11::string::~string((string *)&local_490);
      }
    }
    else {
      cfd::core::Pubkey::GetHex_abi_cxx11_(&local_470,&local_198);
      local_58 = cfd::capi::CreateString((string *)in_stack_fffffffffffffaa0);
      std::__cxx11::string::~string((string *)&local_470);
    }
    if ((in_stack_00000038 != (undefined8 *)0x0) &&
       (bVar1 = cfd::core::ExtPubkey::IsValid(&local_208), bVar1)) {
      cfd::core::ExtPubkey::ToString_abi_cxx11_((string *)&stack0xfffffffffffffb50,&local_208);
      local_60 = cfd::capi::CreateString((string *)in_stack_fffffffffffffaa0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffb50);
    }
    if ((in_stack_00000040 != (undefined8 *)0x0) &&
       (in_stack_fffffffffffffa57 = cfd::core::ExtPrivkey::IsValid(&local_280),
       (bool)in_stack_fffffffffffffa57)) {
      cfd::core::ExtPrivkey::ToString_abi_cxx11_((string *)local_4d0,&local_280);
      local_68 = cfd::capi::CreateString((string *)in_stack_fffffffffffffaa0);
      std::__cxx11::string::~string(local_4d0);
    }
    if (in_stack_00000048 != (undefined1 *)0x0) {
      bVar1 = std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::empty
                        ((vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)
                         CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50));
      if ((bVar1) || (local_1c != local_f4)) {
        *in_stack_00000048 = 0;
      }
      else {
        *in_stack_00000048 = 1;
        if (in_stack_00000050 != (undefined4 *)0x0) {
          sVar2 = std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::size
                            (*(vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>
                               **)(local_a8 + 0x20));
          *in_stack_00000050 = (int)sVar2;
        }
        if (in_stack_00000058 != (uint32_t *)0x0) {
          *in_stack_00000058 = local_f0->multisig_req_sig_num;
        }
      }
    }
    if (local_40 != (char *)0x0) {
      *in_stack_00000008 = local_40;
    }
    if (local_48 != (char *)0x0) {
      *in_stack_00000010 = local_48;
    }
    if (local_50 != (char *)0x0) {
      *in_stack_00000020 = local_50;
    }
    if (local_58 != (char *)0x0) {
      *in_stack_00000030 = local_58;
    }
    if (local_60 != (char *)0x0) {
      *in_stack_00000038 = local_60;
    }
    if (local_68 != (char *)0x0) {
      *in_stack_00000040 = local_68;
    }
    local_4 = 0;
    cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x583674);
    cfd::core::ExtPrivkey::~ExtPrivkey(in_stack_fffffffffffffa40);
    cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffffa40);
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x58369b);
    return local_4;
  }
  local_c0.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_address.cpp"
               ,0x2f);
  local_c0.filename = local_c0.filename + 1;
  local_c0.line = 0x27e;
  local_c0.funcname = "CfdGetDescriptorData";
  cfd::core::logger::warn<>(&local_c0,"index is maximum over.");
  local_e2 = 1;
  uVar3 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"Failed to parameter. index is maximum over.",&local_e1);
  cfd::core::CfdException::CfdException
            ((CfdException *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
             error_code,(string *)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50));
  local_e2 = 0;
  __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetDescriptorData(
    void* handle, void* descriptor_handle, uint32_t index, uint32_t* max_index,
    uint32_t* depth, int* script_type, char** locking_script, char** address,
    int* hash_type, char** redeem_script, int* key_type, char** pubkey,
    char** ext_pubkey, char** ext_privkey, bool* is_multisig,
    uint32_t* max_key_num, uint32_t* req_sig_num) {
  char* work_locking_script = nullptr;
  char* work_address = nullptr;
  char* work_redeem_script = nullptr;
  char* work_pubkey = nullptr;
  char* work_ext_pubkey = nullptr;
  char* work_ext_privkey = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(descriptor_handle, kPrefixOutputDescriptor);

    CfdCapiOutputDescriptor* buffer =
        static_cast<CfdCapiOutputDescriptor*>(descriptor_handle);
    if ((buffer->script_list == nullptr) ||
        (index >= buffer->script_list->size())) {
      warn(CFD_LOG_SOURCE, "index is maximum over.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. index is maximum over.");
    }

    const DescriptorScriptData& desc_data = buffer->script_list->at(index);
    uint32_t last_index =
        static_cast<uint32_t>(buffer->script_list->size()) - 1;
    if (max_index != nullptr) *max_index = last_index;
    if (depth != nullptr) *depth = desc_data.depth;
    if (script_type != nullptr) *script_type = desc_data.type;
    if ((locking_script != nullptr) && (!desc_data.locking_script.IsEmpty())) {
      work_locking_script = CreateString(desc_data.locking_script.GetHex());
    }
    if ((address != nullptr) && (!desc_data.address.GetAddress().empty())) {
      std::string addr = desc_data.address.GetAddress();
      if (!addr.empty()) work_address = CreateString(addr);
    }
    if (hash_type != nullptr) {
      *hash_type = desc_data.address_type;
    }
    if ((redeem_script != nullptr) && (!desc_data.redeem_script.IsEmpty())) {
      work_redeem_script = CreateString(desc_data.redeem_script.GetHex());
    }
    if (key_type != nullptr) {
      *key_type = desc_data.key_type;
    }

    Pubkey pubkey_obj;
    ExtPubkey ext_pubkey_obj;
    ExtPrivkey ext_privkey_obj;
    SchnorrPubkey schnorr_pubkey_obj;
    switch (desc_data.key_type) {
      case DescriptorKeyType::kDescriptorKeyBip32Priv:
        ext_privkey_obj = ExtPrivkey(desc_data.key);
        ext_pubkey_obj = ext_privkey_obj.GetExtPubkey();
        pubkey_obj = ext_pubkey_obj.GetPubkey();
        break;
      case DescriptorKeyType::kDescriptorKeyBip32:
        ext_pubkey_obj = ExtPubkey(desc_data.key);
        pubkey_obj = ext_pubkey_obj.GetPubkey();
        break;
      case DescriptorKeyType::kDescriptorKeySchnorr:
        schnorr_pubkey_obj = SchnorrPubkey(desc_data.key);
        break;
      case DescriptorKeyType::kDescriptorKeyPublic:
      default:
        if (!desc_data.key.empty()) pubkey_obj = Pubkey(desc_data.key);
        break;
    }
    if ((pubkey != nullptr) && (pubkey_obj.IsValid())) {
      work_pubkey = CreateString(pubkey_obj.GetHex());
    } else if ((pubkey != nullptr) && (schnorr_pubkey_obj.IsValid())) {
      work_pubkey = CreateString(schnorr_pubkey_obj.GetHex());
    }
    if ((ext_pubkey != nullptr) && (ext_pubkey_obj.IsValid())) {
      work_ext_pubkey = CreateString(ext_pubkey_obj.ToString());
    }
    if ((ext_privkey != nullptr) && (ext_privkey_obj.IsValid())) {
      work_ext_privkey = CreateString(ext_privkey_obj.ToString());
    }
    if (is_multisig != nullptr) {
      if ((!buffer->multisig_key_list->empty()) && (index == last_index)) {
        *is_multisig = true;
        if (max_key_num != nullptr) {
          *max_key_num =
              static_cast<uint32_t>(buffer->multisig_key_list->size());
        }
        if (req_sig_num != nullptr) {
          *req_sig_num = static_cast<uint32_t>(desc_data.multisig_req_sig_num);
        }
      } else {
        *is_multisig = false;
      }
    }

    if (work_locking_script != nullptr) *locking_script = work_locking_script;
    if (work_address != nullptr) *address = work_address;
    if (work_redeem_script != nullptr) *redeem_script = work_redeem_script;
    if (work_pubkey != nullptr) *pubkey = work_pubkey;
    if (work_ext_pubkey != nullptr) *ext_pubkey = work_ext_pubkey;
    if (work_ext_privkey != nullptr) *ext_privkey = work_ext_privkey;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(
        &work_locking_script, &work_address, &work_redeem_script, &work_pubkey,
        &work_ext_pubkey, &work_ext_privkey);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(
        &work_locking_script, &work_address, &work_redeem_script, &work_pubkey,
        &work_ext_pubkey, &work_ext_privkey);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(
        &work_locking_script, &work_address, &work_redeem_script, &work_pubkey,
        &work_ext_pubkey, &work_ext_privkey);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}